

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O0

double median(double *tab_values,int tab_length)

{
  double dVar1;
  double *x;
  int local_28;
  int n;
  int j;
  int i;
  double temp;
  int tab_length_local;
  double *tab_values_local;
  
  for (n = 0; local_28 = n, n < tab_length + -1; n = n + 1) {
    while (local_28 = local_28 + 1, local_28 < tab_length) {
      if (tab_values[local_28] < tab_values[n]) {
        dVar1 = tab_values[n];
        tab_values[n] = tab_values[local_28];
        tab_values[local_28] = dVar1;
      }
    }
  }
  return tab_values[tab_length / 2];
}

Assistant:

inline double median(double* tab_values, int tab_length)
{
	double temp = 0;
	int i = 0, j = 0;
	int n = tab_length;
	double* x = tab_values;

	// The following two loops sort the array x in ascending order.
	for (i = 0; i < n-1; i++) {
		for (j = i+1; j < n; j++) {
			if (x[j] < x[i]) {
				// Swap elements.
				temp = x[i];
				x[i] = x[j];
				x[j] = temp;
			}
		}
	}

	return x[n/2];
}